

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerVisitedObject.h
# Opt level: O0

void __thiscall IRecyclerVisitedObject::IRecyclerVisitedObject(IRecyclerVisitedObject *this)

{
  IRecyclerVisitedObject *this_local;
  
  this->_vptr_IRecyclerVisitedObject = (_func_int **)&PTR___cxa_pure_virtual_0047a778;
  return;
}

Assistant:

interface IRecyclerVisitedObject
{
    // Called right after finish marking and this object is determined to be dead.
    // Should contain only simple clean up code.
    // Can't run another script
    // Can't cause a re-entrant collection
    virtual void Finalize(bool isShutdown) = 0;

    // Call after sweeping is done.
    // Can call other script or cause another collection.
    virtual void Dispose(bool isShutdown) = 0;

    // Used only by TrackableObjects (created with TrackedBit on by RecyclerNew*Tracked)
    virtual void Mark(RecyclerHeapHandle recycler) = 0;

    // Special behavior on certain GC's
    virtual void OnMark() = 0;

    // Used only by RecyclerVisitedHost objects (created with RecyclerAllocVistedHost_Traced*)
    virtual void Trace(IRecyclerHeapMarkingContext* markingContext) = 0;
}